

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setWrap(Texture *this,deUint32 s,deUint32 t)

{
  GLenum GVar1;
  
  GVar1 = 0x8513;
  if (this->m_type == TEXTURETYPE_2D) {
    GVar1 = 0xde1;
  }
  glwBindTexture(GVar1,this->m_textureGL);
  GVar1 = 0x8513;
  if (this->m_type == TEXTURETYPE_2D) {
    GVar1 = 0xde1;
  }
  glwTexParameteri(GVar1,0x2802,s);
  GVar1 = 0x8513;
  if (this->m_type == TEXTURETYPE_2D) {
    GVar1 = 0xde1;
  }
  glwTexParameteri(GVar1,0x2803,t);
  return;
}

Assistant:

void Texture::setWrap (const deUint32 s, const deUint32 t) const
{
	glBindTexture(getGLBindTarget(), m_textureGL);
	glTexParameteri(getGLBindTarget(), GL_TEXTURE_WRAP_S, s);
	glTexParameteri(getGLBindTarget(), GL_TEXTURE_WRAP_T, t);
}